

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaHelper.h
# Opt level: O0

void __thiscall Assimp::Collada::ChannelEntry::ChannelEntry(ChannelEntry *this)

{
  ChannelEntry *this_local;
  
  this->mChannel = (AnimationChannel *)0x0;
  std::__cxx11::string::string((string *)&this->mTargetId);
  std::__cxx11::string::string((string *)&this->mTransformId);
  this->mTransformIndex = 0;
  this->mSubElement = 0;
  this->mTimeAccessor = (Accessor *)0x0;
  this->mTimeData = (Data *)0x0;
  this->mValueAccessor = (Accessor *)0x0;
  this->mValueData = (Data *)0x0;
  return;
}

Assistant:

ChannelEntry()
      : mChannel()
      , mTransformIndex()
      , mSubElement()
      , mTimeAccessor()
      , mTimeData()
      , mValueAccessor()
      , mValueData()
   {}